

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4-compression.cc
# Opt level: O2

size_t tinyusdz::LZ4Compression::CompressToBuffer
                 (char *input,char *compressed,size_t inputSize,string *err)

{
  int iVar1;
  size_t sVar2;
  ulong uVar3;
  ulong uVar4;
  char *size;
  char **_output;
  bool bVar5;
  char *local_100;
  char *local_f8;
  string local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_f8 = input;
  if (inputSize < 0x3e82000001) {
    if (inputSize < 0x7e000001) {
      *compressed = '\0';
      sVar2 = GetCompressedBufferSize(inputSize);
      iVar1 = LZ4_compress_default(input,compressed + 1,(int)inputSize,(int)sVar2);
      local_100 = compressed + (long)iVar1 + 1;
    }
    else {
      uVar3 = inputSize / 0x7e000000;
      _output = (char **)(inputSize % 0x7e000000);
      uVar4 = (uVar3 + 1) - (ulong)(_output == (char **)0x0);
      if (0x7f < uVar4) {
        if (err != (string *)0x0) {
          std::__cxx11::to_string((string *)&local_d0,0x80);
          ::std::operator+(&local_b0,"# of chunks must be less than 127 but got ",
                           (string *)&local_d0);
          ::std::operator+(&local_90,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_b0,"\n");
          ::std::__cxx11::string::operator=((string *)err,(string *)&local_90);
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
          goto LAB_0026bb52;
        }
        goto LAB_0026bb57;
      }
      size = compressed + 1;
      *compressed = (char)uVar4;
      local_100 = size;
      while (bVar5 = uVar3 != 0, uVar3 = uVar3 - 1, bVar5) {
        CompressToBuffer::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)&local_f8,&local_100,(char **)0x7e000000,(size_t)size)
        ;
      }
      if (_output != (char **)0x0) {
        CompressToBuffer::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)&local_f8,&local_100,_output,(size_t)size);
      }
    }
    sVar2 = (long)local_100 - (long)compressed;
  }
  else {
    if (err != (string *)0x0) {
      std::__cxx11::to_string(&local_f0,inputSize);
      ::std::operator+(&local_50,"Attempted to compress a buffer of ",&local_f0);
      ::std::operator+(&local_d0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_50," bytes, more than the maximum supported ");
      std::__cxx11::to_string(&local_70,0x3e82000000);
      ::std::operator+(&local_b0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_d0,&local_70);
      ::std::operator+(&local_90,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_b0,"\n");
      ::std::__cxx11::string::operator=((string *)err,(string *)&local_90);
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
LAB_0026bb52:
      ::std::__cxx11::string::_M_dispose();
    }
LAB_0026bb57:
    sVar2 = 0;
  }
  return sVar2;
}

Assistant:

size_t LZ4Compression::CompressToBuffer(char const *input, char *compressed,
                                        size_t inputSize, std::string *err) {
  if (inputSize > GetMaxInputSize()) {
    if (err) {
      (*err) = "Attempted to compress a buffer of " +
               std::to_string(inputSize) +
               " bytes, "
               "more than the maximum supported " +
               std::to_string(GetMaxInputSize()) + "\n";
    }
    return 0;
  }

  // If it fits in one chunk, just do it.
  char const *const origCompressed = compressed;
  if (inputSize <= LZ4_MAX_INPUT_SIZE) {
    compressed[0] = 0;  // < zero byte means one chunk.
    compressed += 1 + LZ4_compress_default(input, compressed + 1, int(inputSize),
                                           int(GetCompressedBufferSize(inputSize)));
  } else {
    size_t nWholeChunks = inputSize / LZ4_MAX_INPUT_SIZE;
    size_t partChunkSz = inputSize % LZ4_MAX_INPUT_SIZE;
    size_t numChunks = nWholeChunks + (partChunkSz ? 1 : 0);

    if (numChunks > 127) {
      if (err) {
        (*err) = "# of chunks must be less than 127 but got " + std::to_string(numChunks) + "\n";
      }
      return 0;
    }
    *compressed++ = char(numChunks);
    auto writeChunk = [](char const *&_input, char *&_output, size_t size) {
      char *o = _output;
      _output += sizeof(int32_t);
      int32_t n =
          LZ4_compress_default(_input, _output, int(size), LZ4_compressBound(int(size)));
      memcpy(o, &n, sizeof(n));
      _output += n;
      _input += size;
    };
    for (size_t chunk = 0; chunk != nWholeChunks; ++chunk) {
      writeChunk(input, compressed, LZ4_MAX_INPUT_SIZE);
    }
    if (partChunkSz) {
      writeChunk(input, compressed, partChunkSz);
    }
  }

  return size_t(compressed - origCompressed);
}